

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O2

void HTS_ModelSet_get_gv(HTS_ModelSet *ms,size_t stream_index,char *string,double **iw,double *mean,
                        double *vari)

{
  double weight;
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar1 = (*ms->stream)[stream_index].vector_length;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    mean[sVar2] = 0.0;
    vari[sVar2] = 0.0;
  }
  for (uVar3 = 0; uVar3 < ms->num_voices; uVar3 = uVar3 + 1) {
    weight = iw[uVar3][stream_index];
    if ((weight != 0.0) || (NAN(weight))) {
      HTS_Model_add_parameter(ms->gv[uVar3] + stream_index,2,string,mean,vari,(double *)0x0,weight);
    }
  }
  return;
}

Assistant:

void HTS_ModelSet_get_gv(HTS_ModelSet * ms, size_t stream_index, const char *string, const double *const *iw, double *mean, double *vari)
{
   size_t i;
   size_t len = ms->stream[0][stream_index].vector_length;

   for (i = 0; i < len; i++) {
      mean[i] = 0.0;
      vari[i] = 0.0;
   }
   for (i = 0; i < ms->num_voices; i++)
      if (iw[i][stream_index] != 0.0)
         HTS_Model_add_parameter(&ms->gv[i][stream_index], 2, string, mean, vari, NULL, iw[i][stream_index]);
}